

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

float rsg::AssignOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  Storage SVar2;
  VariableManager *pVVar3;
  bool bVar4;
  int iVar5;
  pointer ppVVar6;
  IsWritableIntersectingEntry local_48;
  
  if ((valueRange.m_type)->m_baseType != TYPE_VOID) {
    bVar4 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
    if (!bVar4) {
      pVVar3 = state->m_varManager;
      local_48.m_valueRange.m_max = valueRange.m_max;
      local_48.m_valueRange.m_type = valueRange.m_type;
      local_48.m_valueRange.m_min = valueRange.m_min;
      ppVVar6 = (pVVar3->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppVVar6 ==
          (pVVar3->m_entryCache).
          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        return 0.0;
      }
      while (bVar4 = anon_unknown_0::IsWritableIntersectingEntry::operator()(&local_48,*ppVVar6),
            !bVar4) {
        ppVVar6 = ppVVar6 + 1;
        if (ppVVar6 ==
            (pVVar3->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          return 0.0;
        }
      }
    }
    if ((valueRange.m_type)->m_baseType != TYPE_VOID) {
      iVar1 = state->m_expressionDepth;
      iVar5 = getTypeConstructorDepth(valueRange.m_type);
      if (state->m_shaderParams->maxExpressionDepth <= iVar5 + iVar1 + 1) {
        return 0.0;
      }
      if ((valueRange.m_type)->m_baseType != TYPE_VOID) goto LAB_00a60a74;
    }
  }
  pVVar3 = state->m_varManager;
  for (ppVVar6 = (pVVar3->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar6 !=
      (pVVar3->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar6 = ppVVar6 + 1) {
    SVar2 = (*ppVVar6)->m_variable->m_storage;
    if ((SVar2 < STORAGE_LAST) && ((0xe5U >> (SVar2 & 0x1f) & 1) != 0)) goto LAB_00a60a74;
  }
  if (state->m_shaderParams->maxCombinedVariableScalars <= pVVar3->m_numAllocatedScalars) {
    return 0.0;
  }
LAB_00a60a74:
  if (state->m_expressionDepth != 0) {
    return 0.0;
  }
  return 4.0;
}

Assistant:

float AssignOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!valueRange.getType().isVoid() &&
		!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsWritableIntersectingEntry(valueRange)))
		return 0.0f; // Would require creating a new variable

	if (!valueRange.getType().isVoid() && state.getExpressionDepth() + getTypeConstructorDepth(valueRange.getType()) + 1 >= state.getShaderParameters().maxExpressionDepth)
		return 0.0f;

	if (valueRange.getType().isVoid() &&
		!state.getVariableManager().hasEntry<IsWritableEntry>() &&
		state.getVariableManager().getNumAllocatedScalars() >= state.getShaderParameters().maxCombinedVariableScalars)
		return 0.0f; // Can not allocate a new entry

	if (state.getExpressionDepth() == 0)
		return 4.0f;
	else
		return 0.0f; // \todo [pyry] Fix assign ops
}